

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::iterate(Texture3DMipmapCase *this)

{
  TextureFormat TVar1;
  CoordType CVar2;
  CoordType CVar3;
  Texture3D *pTVar4;
  RenderContext *context;
  TestLog *pTVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  RenderTarget *pRVar13;
  Surface *pSVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar15;
  uint uVar16;
  byte bVar17;
  long lVar18;
  void *pvVar19;
  long lVar20;
  int iVar21;
  PixelFormat *pPVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int local_4cc;
  RandomViewport viewport;
  float *local_490;
  undefined1 local_480 [40];
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  undefined1 local_428 [40];
  undefined1 local_400 [40];
  Surface referenceFrame;
  undefined1 local_3c0 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_370;
  ulong local_360;
  PixelFormat *local_358;
  Texture3D *local_350;
  LookupPrecision local_348;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  undefined1 local_284 [76];
  _func_int **pp_Stack_238;
  size_type local_230;
  int aiStack_228 [2];
  int local_220;
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  undefined1 auStack_1cc [84];
  ios_base local_178 [264];
  TextureFormatInfo fmtInfo;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar7);
  pTVar4 = this->m_texture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar4->m_refTexture);
  iVar7 = (pTVar4->m_refTexture).m_width;
  iVar10 = (pTVar4->m_refTexture).m_height;
  local_350 = pTVar4;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar8),iVar7 << 2,iVar10 << 2,dVar9)
  ;
  CVar2 = this->m_coordType;
  iVar7 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar7 = viewport.width;
  }
  iVar10 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar10 = viewport.height;
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_284,TEXTURETYPE_3D);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::mapGLSampler((Sampler *)local_1f0,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter
                    ,0x2600);
  local_220 = local_1d0;
  local_230 = local_1e0._M_allocated_capacity;
  aiStack_228[0] = local_1e0._8_4_;
  aiStack_228[1] = local_1e0._12_4_;
  local_284._68_8_ = local_1f0;
  pp_Stack_238 = pp_Stack_1e8;
  local_284._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((pTVar4->m_refTexture).super_TextureLevelPyramid.m_format);
  local_284._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_284._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_284._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_284._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_284._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_284._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_284._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_284._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_284._8_4_ = (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2
  ;
  (**(code **)(lVar18 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(lVar18 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(lVar18 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(lVar18 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(lVar18 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar18 + 0x1360))(0x806f,0x2800,0x2600);
  dVar9 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar9,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x505);
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  iVar7 = iVar7 >> 2;
  iVar10 = iVar10 >> 2;
  uVar16 = 0;
  lVar12 = 0;
  do {
    iVar8 = iVar10 * (int)lVar12;
    iVar15 = 0;
    iVar21 = 0;
    uVar24 = uVar16;
    for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 0x10) {
      iVar11 = viewport.width + iVar21;
      if (lVar20 != 0x30) {
        iVar11 = iVar7;
      }
      iVar6 = viewport.height - iVar8;
      if (lVar12 != 3) {
        iVar6 = iVar10;
      }
      CVar3 = this->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_01137e8b:
        getBasicTexCoord3D(&texCoord,uVar24);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D(&texCoord,uVar24);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_01137e8b;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_284._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar20);
        local_284._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar20 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_284._28_4_ = deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar24 & 7];
      }
      (**(code **)(lVar18 + 0x1a00))(viewport.x + iVar15,viewport.y + iVar8,iVar11,iVar6);
      uVar24 = uVar24 + 1;
      iVar21 = iVar21 - iVar7;
      iVar15 = iVar15 + iVar7;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_284);
    }
    lVar12 = lVar12 + 1;
    uVar16 = uVar16 + 4;
  } while (lVar12 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res.m_data[0] = 8;
  res.m_data[1] = 3;
  pvVar19 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar19 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f0,(TextureFormat *)&res,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar19);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar16 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  pPVar22 = &pRVar13->m_pixelFormat;
  uVar16 = ~(uint)((uVar16 & 0xfffffffe) == 0x2702);
  local_348.uvwBits.m_data[1] = 0x10;
  local_348.uvwBits.m_data[2] = 0x10;
  local_348.colorThreshold.m_data[0] = 0.0;
  local_348.colorThreshold.m_data[1] = 0.0;
  local_348.colorThreshold.m_data[2] = 0.0;
  local_348.colorThreshold.m_data[3] = 0.0;
  local_348.colorMask.m_data[0] = true;
  local_348.colorMask.m_data[1] = true;
  local_348.colorMask.m_data[2] = true;
  local_348.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_348.coordBits.m_data[0] = 0x14;
  local_348.coordBits.m_data[1] = 0x14;
  local_348.coordBits.m_data[2] = 0x14;
  local_348.uvwBits.m_data[0] = 0x10;
  uVar24 = uVar16 + pPVar22->redBits;
  uVar25 = uVar16 + (pRVar13->m_pixelFormat).greenBits;
  uVar26 = uVar16 + (pRVar13->m_pixelFormat).blueBits;
  uVar16 = uVar16 + (pRVar13->m_pixelFormat).alphaBits;
  res.m_data[1] = -(uint)(0 < (int)uVar25) & uVar25;
  res.m_data[0] = -(uint)(0 < (int)uVar24) & uVar24;
  res.m_data[3] = -(uint)(0 < (int)uVar16) & uVar16;
  res.m_data[2] = -(uint)(0 < (int)uVar26) & uVar26;
  tcu::computeFixedPointThreshold((tcu *)local_1f0,&res);
  auVar23._0_4_ = -(uint)(0 < pPVar22->redBits);
  auVar23._4_4_ = -(uint)(0 < (pRVar13->m_pixelFormat).greenBits);
  auVar23._8_4_ = -(uint)(0 < (pRVar13->m_pixelFormat).blueBits);
  auVar23._12_4_ = -(uint)(0 < (pRVar13->m_pixelFormat).alphaBits);
  uVar16 = movmskps((int)local_1f0,auVar23);
  bVar17 = (byte)uVar16;
  local_348.colorMask.m_data =
       (bool  [4])
       (uVar16 & 1 | (uint)((bVar17 & 2) >> 1) << 8 | (uint)((bVar17 & 4) >> 2) << 0x10 |
       (uint)(bVar17 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  uVar16 = 0;
  lVar18 = 0;
  local_4cc = 0;
  local_358 = pPVar22;
  do {
    local_360 = (ulong)uVar16;
    local_490 = deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias + (uVar16 & 7);
    iVar8 = iVar10 * (int)lVar18;
    lVar12 = 0;
    iVar21 = 0;
    iVar15 = 0;
    do {
      iVar11 = viewport.width + iVar15;
      if (lVar12 != 0x30) {
        iVar11 = iVar7;
      }
      iVar6 = viewport.height - iVar8;
      if (lVar18 != 3) {
        iVar6 = iVar10;
      }
      CVar3 = this->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_011381d5:
        getBasicTexCoord3D(&texCoord,uVar16);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D(&texCoord,uVar16);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_011381d5;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_284._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar12);
        local_284._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar12 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_284._28_4_ = *local_490;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1f0,&referenceFrame,local_358,iVar21,iVar8,iVar11,iVar6);
      res.m_data._8_8_ = (local_350->m_refTexture).m_view.m_levels;
      res.m_data[0] = (local_350->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1f0,(Texture3DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_284);
      local_480._0_4_ = RGBA;
      local_480._4_4_ = UNORM_INT8;
      pvVar19 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar19 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_480,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar19);
      tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&res,iVar21,iVar8,iVar11
                        ,iVar6);
      local_428._0_4_ = RGBA;
      local_428._4_4_ = UNORM_INT8;
      pvVar19 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar19 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_400,(TextureFormat *)local_428,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar19);
      tcu::getSubregion((PixelBufferAccess *)local_480,(PixelBufferAccess *)local_400,iVar21,iVar8,
                        iVar11,iVar6);
      local_370.m_numLevels = 8;
      local_370._4_4_ = 3;
      pvVar19 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar19 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3c0,(TextureFormat *)&local_370,errorMask.m_width,
                 errorMask.m_height,1,pvVar19);
      tcu::getSubregion((PixelBufferAccess *)local_428,(PixelBufferAccess *)local_3c0,iVar21,iVar8,
                        iVar11,iVar6);
      local_370.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_370.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar11 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_1f0,(ConstPixelBufferAccess *)local_480,
                          (PixelBufferAccess *)local_428,&local_370,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_284,&local_348,
                          &lodPrec,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                                   ->m_watchDog);
      local_4cc = local_4cc + iVar11;
      iVar15 = iVar15 - iVar7;
      iVar21 = iVar21 + iVar7;
      lVar12 = lVar12 + 0x10;
      uVar16 = uVar16 + 1;
      local_490 = local_490 + 1;
    } while (lVar12 != 0x40);
    lVar18 = lVar18 + 1;
    uVar16 = (int)local_360 + 4;
    if (lVar18 == 4) {
      if (0 < local_4cc) {
        local_1f0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1e8,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<((ostringstream *)&pp_Stack_1e8,local_4cc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1e8," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
        std::ios_base::~ios_base(local_178);
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_480._0_8_ = (long)local_480 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Result","");
      local_400._0_8_ = (long)local_400 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_480,(string *)local_400);
      tcu::TestLog::startImageSet(pTVar5,(char *)res.m_data._0_8_,local_2f8._M_p);
      local_428._0_8_ = (long)local_428 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Rendered","");
      TVar1 = (TextureFormat)((long)local_3c0 + 0x10);
      local_3c0._0_8_ = TVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Rendered image","");
      pSVar14 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f0,(string *)local_428,(string *)local_3c0,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f0,(int)pTVar5,__buf,(size_t)pSVar14);
      if ((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0) != auStack_1cc + 0xc) {
        operator_delete((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0),
                        CONCAT44(auStack_1cc._16_4_,auStack_1cc._12_4_) + 1);
      }
      if (local_1f0 != (undefined1  [8])&local_1e0) {
        operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
      }
      if ((TextureFormat)local_3c0._0_8_ != TVar1) {
        operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
      }
      if (local_428._0_8_ != (long)local_428 + 0x10) {
        operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_p != local_2e8) {
        operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_308) {
        operator_delete((void *)res.m_data._0_8_,local_308._M_allocated_capacity + 1);
      }
      if (local_400._0_8_ != (long)local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if (local_480._0_8_ != (long)local_480 + 0x10) {
        operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
      }
      if (0 < local_4cc) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_480._0_8_ = (long)local_480 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Reference","");
        local_400._0_8_ = (long)local_400 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Ideal reference","");
        pSVar14 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1f0,(string *)local_480,(string *)local_400,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar7 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_1f0,iVar7,__buf_00,(size_t)pSVar14);
        local_428._0_8_ = (long)local_428 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"ErrorMask","");
        local_3c0._0_8_ = TVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Error mask","");
        pSVar14 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)local_428,(string *)local_3c0,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res,iVar7,__buf_01,(size_t)pSVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_p != local_2e8) {
          operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.m_data._0_8_ != &local_308) {
          operator_delete((void *)res.m_data._0_8_,local_308._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_3c0._0_8_ != TVar1) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
        }
        if (local_428._0_8_ != (long)local_428 + 0x10) {
          operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
        }
        if ((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0) != auStack_1cc + 0xc) {
          operator_delete((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0),
                          CONCAT44(auStack_1cc._16_4_,auStack_1cc._12_4_) + 1);
        }
        if (local_1f0 != (undefined1  [8])&local_1e0) {
          operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
        }
        if (local_400._0_8_ != (long)local_400 + 0x10) {
          operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
        }
        if (local_480._0_8_ != (long)local_480 + 0x10) {
          operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      description = "Pass";
      if (local_4cc != 0) {
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(local_4cc != 0),description);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tcu::Surface::~Surface(&renderedFrame);
      return STOP;
    }
  } while( true );
}

Assistant:

Texture3DMipmapCase::IterateResult Texture3DMipmapCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();
	const deUint32					magFilter			= GL_NEAREST;

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	const bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			// Set projection.
			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			// Set LOD bias.
			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}